

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

void __thiscall
CLIntercept::addMapPointer(CLIntercept *this,void *ptr,cl_map_flags flags,size_t size)

{
  bool bVar1;
  mapped_type *pmVar2;
  size_t in_RCX;
  cl_map_flags in_RDX;
  long in_RSI;
  CLIntercept *in_RDI;
  double __x;
  SMapPointerInfo *mapPointerInfo;
  lock_guard<std::mutex> lock;
  map<const_void_*,_CLIntercept::SMapPointerInfo,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_CLIntercept::SMapPointerInfo>_>_>
  *in_stack_ffffffffffffff68;
  lock_guard<std::mutex> *in_stack_ffffffffffffff70;
  allocator *paVar3;
  allocator local_69;
  string local_68 [16];
  key_type *in_stack_ffffffffffffffa8;
  map<const_void_*,_CLIntercept::SMapPointerInfo,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_CLIntercept::SMapPointerInfo>_>_>
  *in_stack_ffffffffffffffb0;
  _Self local_48 [3];
  _Self local_30 [2];
  size_t local_20;
  cl_map_flags local_18;
  
  if (in_RSI != 0) {
    local_20 = in_RCX;
    local_18 = in_RDX;
    std::lock_guard<std::mutex>::lock_guard
              (in_stack_ffffffffffffff70,(mutex_type *)in_stack_ffffffffffffff68);
    local_30[0]._M_node =
         (_Base_ptr)
         std::
         map<const_void_*,_CLIntercept::SMapPointerInfo,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_CLIntercept::SMapPointerInfo>_>_>
         ::find(in_stack_ffffffffffffff68,(key_type *)0x2122dc);
    local_48[0]._M_node =
         (_Base_ptr)
         std::
         map<const_void_*,_CLIntercept::SMapPointerInfo,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_CLIntercept::SMapPointerInfo>_>_>
         ::end(in_stack_ffffffffffffff68);
    bVar1 = std::operator!=(local_30,local_48);
    if (bVar1) {
      paVar3 = &local_69;
      std::allocator<char>::allocator();
      __x = (double)std::__cxx11::string::string
                              (local_68,"Ignoring duplicate mapped pointer.\n",paVar3);
      log(in_RDI,__x);
      std::__cxx11::string::~string(local_68);
      std::allocator<char>::~allocator((allocator<char> *)&local_69);
    }
    else {
      pmVar2 = std::
               map<const_void_*,_CLIntercept::SMapPointerInfo,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_CLIntercept::SMapPointerInfo>_>_>
               ::operator[](in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      pmVar2->Flags = local_18;
      pmVar2->Size = local_20;
    }
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x212403);
  }
  return;
}

Assistant:

void CLIntercept::addMapPointer(
    const void* ptr,
    const cl_map_flags flags,
    const size_t size )
{
    if( ptr )
    {
        std::lock_guard<std::mutex> lock(m_Mutex);

        if( m_MapPointerInfoMap.find(ptr) != m_MapPointerInfoMap.end() )
        {
            log( "Ignoring duplicate mapped pointer.\n" );
        }
        else
        {
            SMapPointerInfo&    mapPointerInfo = m_MapPointerInfoMap[ptr];

            mapPointerInfo.Flags = flags;
            mapPointerInfo.Size = size;
        }
    }
}